

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall Thread::start(Thread *this)

{
  int iVar1;
  ThreadData *this_00;
  void *__stat_loc;
  ThreadFunc *in_RDI;
  ThreadData *unaff_retaddr;
  ThreadData *data;
  CountDownLatch *in_stack_ffffffffffffffe0;
  pid_t *in_stack_ffffffffffffffe8;
  string *in_stack_fffffffffffffff0;
  ThreadData *pTVar2;
  ThreadFunc *func;
  
  if ((((in_RDI->super__Function_base)._M_functor._M_pod_data[0] ^ 0xffU) & 1) == 0) {
    __assert_fail("!started_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x53,"void Thread::start()");
  }
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0] = '\x01';
  func = in_RDI;
  this_00 = (ThreadData *)operator_new(0x50);
  ThreadData::ThreadData
            (unaff_retaddr,func,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
  __stat_loc = (void *)0x0;
  pTVar2 = this_00;
  iVar1 = pthread_create((pthread_t *)((in_RDI->super__Function_base)._M_functor._M_pod_data + 8),
                         (pthread_attr_t *)0x0,startThread,this_00);
  if (iVar1 == 0) {
    CountDownLatch::wait((CountDownLatch *)&in_RDI[2]._M_invoker,__stat_loc);
    if (*(int *)&(in_RDI->super__Function_base)._M_manager < 1) {
      __assert_fail("tid_>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                    ,0x5b,"void Thread::start()");
    }
  }
  else {
    (in_RDI->super__Function_base)._M_functor._M_pod_data[0] = '\0';
    if (pTVar2 != (ThreadData *)0x0) {
      ThreadData::~ThreadData(this_00);
      operator_delete(pTVar2,0x50);
    }
  }
  return;
}

Assistant:

void Thread::start(){
    assert(!started_);
    started_=true;
    ThreadData* data=new ThreadData(func_,name_,&tid_,&latch_);
    if(pthread_create(&pthreadId_, nullptr, &startThread, data)){
        started_=false;
        delete data;
    }else {
        latch_.wait();
        assert(tid_>0);
    }
}